

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::Descriptor::GetLocationPath
          (Descriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  iterator iVar4;
  int local_14;
  
  if (*(Descriptor **)(this + 0x18) == (Descriptor *)0x0) {
    iVar4._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    if (iVar4._M_current == piVar1) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar4,&local_14);
      lVar2 = *(long *)(this + 0x18);
      iVar4._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 4;
      iVar4._M_current = iVar4._M_current + 1;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar4._M_current;
      lVar2 = 0;
    }
    plVar3 = (long *)(*(long *)(this + 0x10) + 0x68);
    if (lVar2 != 0) {
      plVar3 = (long *)(lVar2 + 0x38);
    }
    lVar2 = *plVar3;
  }
  else {
    GetLocationPath(*(Descriptor **)(this + 0x18),output);
    iVar4._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    if (iVar4._M_current == piVar1) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar4,&local_14);
      iVar4._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 3;
      iVar4._M_current = iVar4._M_current + 1;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar4._M_current;
    }
    plVar3 = (long *)(*(long *)(this + 0x10) + 0x68);
    if (*(long *)(this + 0x18) != 0) {
      plVar3 = (long *)(*(long *)(this + 0x18) + 0x38);
    }
    lVar2 = *plVar3;
  }
  if (iVar4._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar4,&local_14);
  }
  else {
    *iVar4._M_current = (int)((ulong)((long)this - lVar2) >> 4) * 0x38e38e39;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  return;
}

Assistant:

void Descriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kNestedTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kMessageTypeFieldNumber);
    output->push_back(index());
  }
}